

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::evalSequenceSideEffCase3(ShaderEvalContext *ctx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = ctx->in[0].m_data[0];
  fVar2 = ctx->in[0].m_data[2];
  fVar3 = ctx->in[0].m_data[3];
  fVar4 = ctx->in[1].m_data[0];
  fVar5 = ctx->in[1].m_data[1];
  fVar6 = ctx->in[1].m_data[2];
  fVar7 = ctx->in[2].m_data[1];
  fVar8 = ctx->in[2].m_data[2];
  fVar9 = ctx->in[2].m_data[3];
  (ctx->color).m_data[0] =
       (float)((int)((float)(-(uint)(0.0 < ctx->in[2].m_data[0]) & 0x3f800000) +
                    ctx->in[0].m_data[1]) + (int)ctx->in[1].m_data[3]);
  (ctx->color).m_data[1] =
       (float)((int)((float)(-(uint)(0.0 < fVar9) & 0x3f800000) + fVar2) + (int)fVar6);
  (ctx->color).m_data[2] =
       (float)((int)((float)(-(uint)(0.0 < fVar8) & 0x3f800000) + fVar3) + (int)fVar5);
  (ctx->color).m_data[3] =
       (float)((int)((float)(-(uint)(0.0 < fVar7) & 0x3f800000) + fVar1) + (int)fVar4);
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }